

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall
QHybrid::QHybrid(QHybrid *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
                Qheur_t QheurTypeFirstTimeSteps,QFunctionJointBeliefInterface *QlastTimeSteps,
                size_t horizonLastTimeSteps)

{
  long lVar1;
  undefined8 *puVar2;
  
  this->super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005a0d98;
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            ((QFunctionForDecPOMDP *)&this->field_0x68,&PTR_construction_vtable_128__005a0c08,pu);
  this->super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5a0a68;
  *(undefined8 *)&this->field_0x68 = 0x5a0b58;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_ = (pointer)0x0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size1_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_QTableInterface._vptr_QTableInterface =
       (_func_int **)&PTR_Get_005cdfc0;
  this->_m_QheurTypeFirstTS = QheurTypeFirstTimeSteps;
  this->_m_QlastTimeSteps = QlastTimeSteps;
  this->_m_horizonLastTimeSteps = horizonLastTimeSteps;
  lVar1 = *(long *)&this->field_0x70;
  if (lVar1 == 0) {
    lVar1 = *(long *)&this->field_0x78;
  }
  this->_m_horizonFirstTimeSteps = *(long *)(lVar1 + 0x18) - horizonLastTimeSteps;
  this->_m_optimizedHorLast = false;
  this->_m_initialized = false;
  if (horizonLastTimeSteps < *(ulong *)(lVar1 + 0x18)) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar2 + 1),
             "QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon","");
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

QHybrid::QHybrid(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
                 Qheur_t QheurTypeFirstTimeSteps,
                 QFunctionJointBeliefInterface *QlastTimeSteps,
                 size_t horizonLastTimeSteps) : 
    QFunctionForDecPOMDP(pu), //virtual base first
    _m_QheurTypeFirstTS(QheurTypeFirstTimeSteps),
    _m_QlastTimeSteps(QlastTimeSteps),
    _m_horizonLastTimeSteps(horizonLastTimeSteps),
    _m_horizonFirstTimeSteps(GetPU()->GetHorizon()-horizonLastTimeSteps),
    _m_optimizedHorLast(false),
    _m_initialized(false)
{
    if(horizonLastTimeSteps>=GetPU()->GetHorizon())
        throw(E("QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon"));
}